

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_MSR_v7m(DisasContext_conflict1 *s,arg_MSR_v7m *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 arg2;
  TCGv_i32 arg3;
  TCGv_i32 reg;
  TCGv_i32 addr;
  TCGContext_conflict1 *tcg_ctx;
  arg_MSR_v7m *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,9);
  if (iVar1 != 0) {
    arg2 = tcg_const_i32_aarch64(tcg_ctx_00,a->mask << 10 | a->sysm);
    arg3 = load_reg(s,a->rn);
    gen_helper_v7m_msr(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,arg3);
    tcg_temp_free_i32(tcg_ctx_00,arg2);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
    gen_helper_rebuild_hflags_m32_newel(tcg_ctx_00,tcg_ctx_00->cpu_env);
    gen_lookup_tb(s);
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_MSR_v7m(DisasContext *s, arg_MSR_v7m *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, reg;

    if (!arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    addr = tcg_const_i32(tcg_ctx, (a->mask << 10) | a->sysm);
    reg = load_reg(s, a->rn);
    gen_helper_v7m_msr(tcg_ctx, tcg_ctx->cpu_env, addr, reg);
    tcg_temp_free_i32(tcg_ctx, addr);
    tcg_temp_free_i32(tcg_ctx, reg);
    /* If we wrote to CONTROL, the EL might have changed */
    gen_helper_rebuild_hflags_m32_newel(tcg_ctx, tcg_ctx->cpu_env);
    gen_lookup_tb(s);
    return true;
}